

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::ComputeLessThanRange::operator()
          (ComputeLessThanRange *this,Random *rnd,bool dstMin,bool dstMax,int *aMin,int *aMax,
          int *bMin,int *bMax)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  dVar2 = deRandom_getUint32(&rnd->m_rnd);
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  iVar7 = dVar3 % 9 - 4;
  iVar1 = iVar7 + dVar2 % 9;
  if (dstMax && !dstMin) {
    *aMin = iVar7;
    *aMax = iVar1;
  }
  else {
    dVar4 = deRandom_getUint32(&rnd->m_rnd);
    uVar5 = dVar4 % (9 - dVar2 % 9);
    if (dstMin && dstMax) {
      iVar6 = dVar3 % 9 - 5;
      *aMax = iVar6;
      *aMin = iVar6 - uVar5;
    }
    else {
      *aMin = iVar1;
      *aMax = uVar5 + iVar1;
    }
  }
  *bMin = iVar7;
  *bMax = iVar1;
  return;
}

Assistant:

void ComputeLessThanRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin - getStep<T>();
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax;
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}